

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Text_Buffer.cxx
# Opt level: O0

int __thiscall Fl_Text_Buffer::next_char(Fl_Text_Buffer *this,int pos)

{
  char c;
  int iVar1;
  int n;
  int pos_local;
  Fl_Text_Buffer *this_local;
  
  c = byte_at(this,pos);
  iVar1 = fl_utf8len1(c);
  this_local._4_4_ = iVar1 + pos;
  if (this->mLength <= this_local._4_4_) {
    this_local._4_4_ = this->mLength;
  }
  return this_local._4_4_;
}

Assistant:

int Fl_Text_Buffer::next_char(int pos) const
{
  IS_UTF8_ALIGNED2(this, (pos))  
  int n = fl_utf8len1(byte_at(pos));
  pos += n;
  if (pos>=mLength)
    return mLength;
  IS_UTF8_ALIGNED2(this, (pos))  
  return pos;
}